

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O1

QString * Driver::qtify(QString *__return_storage_ptr__,QString *name)

{
  Data *pDVar1;
  long lVar2;
  char16_t cVar3;
  int iVar4;
  long lVar5;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar1 = (name->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (name->d).ptr;
  (__return_storage_ptr__->d).size = (name->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  cVar3 = *(__return_storage_ptr__->d).ptr;
  if ((cVar3 == L'Q') || (cVar3 == L'K')) {
    QString::remove((longlong)__return_storage_ptr__,0);
  }
  lVar2 = (__return_storage_ptr__->d).size;
  if (lVar2 != 0) {
    lVar5 = 0;
    do {
      cVar3 = (__return_storage_ptr__->d).ptr[lVar5];
      if (0x19 < (ushort)cVar3 - 0x41) {
        if ((ushort)cVar3 < 0x80) {
          return __return_storage_ptr__;
        }
        iVar4 = QChar::category((uint)(ushort)cVar3);
        if (iVar4 != 0xe) {
          return __return_storage_ptr__;
        }
      }
      cVar3 = QChar::toLower((uint)(ushort)cVar3);
      pDVar1 = (__return_storage_ptr__->d).d;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData
                  ((longlong)__return_storage_ptr__,
                   (AllocationOption)(__return_storage_ptr__->d).size);
      }
      (__return_storage_ptr__->d).ptr[lVar5] = cVar3;
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

QString Driver::qtify(const QString &name)
{
    QString qname = name;

    if (qname.at(0) == u'Q' || qname.at(0) == u'K')
        qname.remove(0, 1);

    for (qsizetype i = 0, size = qname.size(); i < size && qname.at(i).isUpper(); ++i)
        qname[i] = qname.at(i).toLower();

    return qname;
}